

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O2

double time_cc<trng::yarn4>(yarn4 *r)

{
  time_t *in_RSI;
  long lVar1;
  bool bVar2;
  double dVar3;
  double extraout_XMM0_Qa;
  double local_58;
  timer T;
  string res;
  double local_20;
  
  T._resolution = 1e-06;
  T._t.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_58 = 0.0;
  lVar1 = 0x1000000;
  while (bVar2 = lVar1 != 0, lVar1 = lVar1 + -1, bVar2) {
    dVar3 = trng::utility::u01xx_traits<double,_1UL,_trng::yarn4>::cc(r);
    local_58 = local_58 + dVar3;
  }
  timer::time(&T,in_RSI);
  local_20 = 16.777216 / extraout_XMM0_Qa;
  to_string<double>(&res,&local_20);
  while (res._M_string_length < 10) {
    std::__cxx11::string::push_back((char)&res);
  }
  std::operator<<((ostream *)&std::cout,(string *)&res);
  std::__cxx11::string::~string((string *)&res);
  return local_58;
}

Assistant:

double time_cc(R &r) {
  double s{0};
  timer T;
  long max(1l << 24);
  for (long i{0}; i < max; ++i)
    s += trng::utility::uniformcc<double>(r);
  std::string res(to_string(1e-6 * max / T.time()));
  while (res.length() < 10)
    res += ' ';
  std::cout << res;
  return s;
}